

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

SmallVectorImpl<llvm::DWARFDebugMacro::Entry> * __thiscall
llvm::SmallVectorImpl<llvm::DWARFDebugMacro::Entry>::operator=
          (SmallVectorImpl<llvm::DWARFDebugMacro::Entry> *this,
          SmallVectorImpl<llvm::DWARFDebugMacro::Entry> *RHS)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong MinSize;
  
  if (this != RHS) {
    uVar1 = (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
            super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.
            super_SmallVectorBase.Size;
    MinSize = (ulong)uVar1;
    uVar2 = (this->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
            super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.
            super_SmallVectorBase.Size;
    uVar4 = (ulong)uVar2;
    if (uVar2 < uVar1) {
      if ((this->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
          super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.super_SmallVectorBase.
          Capacity < uVar1) {
        uVar4 = 0;
        SmallVectorBase::set_size((SmallVectorBase *)this,0);
        SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>::grow
                  (&this->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>,MinSize)
        ;
      }
      else if (uVar4 == 0) {
        uVar4 = 0;
      }
      else {
        memmove((this->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
                super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.
                super_SmallVectorBase.BeginX,
                (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
                super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.
                super_SmallVectorBase.BeginX,uVar4 * 0x18);
      }
      lVar3 = (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
              super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.
              super_SmallVectorBase.Size - uVar4;
      if (lVar3 != 0) {
        memcpy((void *)(uVar4 * 0x18 +
                       (long)(this->
                             super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
                             super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.
                             super_SmallVectorBase.BeginX),
               (void *)((long)(RHS->
                              super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
                              super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.
                              super_SmallVectorBase.BeginX + uVar4 * 0x18),lVar3 * 0x18);
      }
    }
    else if (MinSize != 0) {
      memmove((this->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
              super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.
              super_SmallVectorBase.BeginX,
              (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>).
              super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.
              super_SmallVectorBase.BeginX,MinSize * 0x18);
    }
    SmallVectorBase::set_size((SmallVectorBase *)this,MinSize);
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->set_size(RHSSize);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->set_size(0);
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->set_size(RHSSize);
  return *this;
}